

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

void ImageDrawText(Image *dst,char *text,int posX,int posY,int fontSize,Color color)

{
  Font font;
  Vector2 position;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined4 local_54;
  
  GetFontDefault();
  if (local_54 == 0) {
    LoadFontDefault();
  }
  position.x = (float)posX;
  position.y = (float)posY;
  GetFontDefault();
  font._8_8_ = uStack_88;
  font._0_8_ = local_90;
  font.texture._4_8_ = local_80;
  font.texture._12_8_ = uStack_78;
  font.recs = (Rectangle *)local_70;
  font.glyphs = uStack_68;
  ImageDrawTextEx(dst,font,text,position,(float)fontSize,1.0,color);
  return;
}

Assistant:

void ImageDrawText(Image *dst, const char *text, int posX, int posY, int fontSize, Color color)
{
#if defined(SUPPORT_MODULE_RTEXT) && defined(SUPPORT_DEFAULT_FONT)
    // Make sure default font is loaded to be used on image text drawing
    if (GetFontDefault().texture.id == 0) LoadFontDefault();

    Vector2 position = { (float)posX, (float)posY };
    ImageDrawTextEx(dst, GetFontDefault(), text, position, (float)fontSize, 1.0f, color);   // WARNING: Module required: rtext
#else
    TRACELOG(LOG_WARNING, "IMAGE: ImageDrawText() requires module: rtext");
#endif
}